

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cc
# Opt level: O0

void __thiscall
phosg::Image::write_pixel
          (Image *this,ssize_t x,ssize_t y,uint64_t r,uint64_t g,uint64_t b,uint64_t a)

{
  out_of_range *this_00;
  logic_error *this_01;
  long lVar1;
  int iVar2;
  size_t index;
  uint64_t b_local;
  uint64_t g_local;
  uint64_t r_local;
  ssize_t y_local;
  ssize_t x_local;
  Image *this_local;
  
  if ((((-1 < x) && (-1 < y)) && (x < this->width)) && (y < this->height)) {
    iVar2 = 3;
    if ((this->has_alpha & 1U) != 0) {
      iVar2 = 4;
    }
    lVar1 = (y * this->width + x) * (long)iVar2;
    if (this->channel_width == '\b') {
      *(char *)((long)(this->data).raw + lVar1) = (char)r;
      *(char *)((long)(this->data).raw + lVar1 + 1) = (char)g;
      *(char *)((long)(this->data).raw + lVar1 + 2) = (char)b;
      if ((this->has_alpha & 1U) != 0) {
        *(char *)((long)(this->data).raw + lVar1 + 3) = (char)a;
      }
    }
    else if (this->channel_width == '\x10') {
      *(short *)((long)(this->data).raw + lVar1 * 2) = (short)r;
      *(short *)((long)(this->data).raw + lVar1 * 2 + 2) = (short)g;
      *(short *)((long)(this->data).raw + lVar1 * 2 + 4) = (short)b;
      if ((this->has_alpha & 1U) != 0) {
        *(short *)((long)(this->data).raw + lVar1 * 2 + 6) = (short)a;
      }
    }
    else if (this->channel_width == ' ') {
      *(int *)((long)(this->data).raw + lVar1 * 4) = (int)r;
      *(int *)((long)(this->data).raw + lVar1 * 4 + 4) = (int)g;
      *(int *)((long)(this->data).raw + lVar1 * 4 + 8) = (int)b;
      if ((this->has_alpha & 1U) != 0) {
        *(int *)((long)(this->data).raw + lVar1 * 4 + 0xc) = (int)a;
      }
    }
    else {
      if (this->channel_width != '@') {
        this_01 = (logic_error *)__cxa_allocate_exception(0x10);
        ::std::logic_error::logic_error(this_01,"image channel width is not 8, 16, 32, or 64");
        __cxa_throw(this_01,&::std::logic_error::typeinfo,::std::logic_error::~logic_error);
      }
      *(uint64_t *)((long)(this->data).raw + lVar1 * 8) = r;
      *(uint64_t *)((long)(this->data).raw + lVar1 * 8 + 8) = g;
      *(uint64_t *)((long)(this->data).raw + lVar1 * 8 + 0x10) = b;
      if ((this->has_alpha & 1U) != 0) {
        *(uint64_t *)((long)(this->data).raw + lVar1 * 8 + 0x18) = a;
      }
    }
    return;
  }
  this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
  ::std::out_of_range::out_of_range(this_00,"out of bounds");
  __cxa_throw(this_00,&::std::out_of_range::typeinfo,::std::out_of_range::~out_of_range);
}

Assistant:

void Image::write_pixel(ssize_t x, ssize_t y, uint64_t r, uint64_t g,
    uint64_t b, uint64_t a) {

  // check coordinates
  if (x < 0 || y < 0 || x >= this->width || y >= this->height) {
    throw out_of_range("out of bounds");
  }

  size_t index = (y * this->width + x) * (this->has_alpha ? 4 : 3);
  if (this->channel_width == 8) {
    this->data.as8[index] = r;
    this->data.as8[index + 1] = g;
    this->data.as8[index + 2] = b;
    if (this->has_alpha) {
      this->data.as8[index + 3] = a;
    }
  } else if (this->channel_width == 16) {
    this->data.as16[index] = r;
    this->data.as16[index + 1] = g;
    this->data.as16[index + 2] = b;
    if (this->has_alpha) {
      this->data.as16[index + 3] = a;
    }
  } else if (this->channel_width == 32) {
    this->data.as32[index] = r;
    this->data.as32[index + 1] = g;
    this->data.as32[index + 2] = b;
    if (this->has_alpha) {
      this->data.as32[index + 3] = a;
    }
  } else if (this->channel_width == 64) {
    this->data.as64[index] = r;
    this->data.as64[index + 1] = g;
    this->data.as64[index + 2] = b;
    if (this->has_alpha) {
      this->data.as64[index + 3] = a;
    }
  } else {
    throw logic_error("image channel width is not 8, 16, 32, or 64");
  }
}